

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_help.c
# Opt level: O3

void tool_help(char *category)

{
  char *pcVar1;
  int iVar2;
  long lVar3;
  curlhelp_t category_00;
  char *pcVar4;
  long lVar5;
  category_descriptors *pcVar6;
  
  puts("Usage: curl [options...] <url>");
  if (category == (char *)0x0) {
    print_category(0x200);
    puts(
        "\nThis is not the full help, this menu is stripped into categories.\nUse \"--help category\" to get an overview of all categories.\nFor all options use the manual or \"--help all\"."
        );
  }
  else {
    iVar2 = curl_strequal(category,"all");
    if (iVar2 == 0) {
      iVar2 = curl_strequal(category,"category");
      if (iVar2 != 0) {
        lVar5 = 0x18;
        pcVar4 = "auth";
        do {
          pcVar1 = *(char **)((long)&categories[0].opt + lVar5);
          printf(" %-11s %s\n",pcVar4,*(undefined8 *)((long)&helptext[0xea].categories + lVar5));
          lVar5 = lVar5 + 0x18;
          pcVar4 = pcVar1;
        } while (lVar5 != 0x228);
        goto LAB_00112265;
      }
      pcVar4 = "auth";
      iVar2 = curl_strequal("auth",category);
      if (iVar2 == 0) {
        lVar5 = 0;
        do {
          lVar3 = lVar5;
          if (lVar3 + 0x18 == 0x210) {
            puts("Invalid category provided, here is a list of all categories:\n");
            lVar5 = 0x18;
            pcVar4 = "auth";
            do {
              pcVar1 = *(char **)((long)&categories[0].opt + lVar5);
              printf(" %-11s %s\n",pcVar4,*(undefined8 *)((long)&helptext[0xea].categories + lVar5))
              ;
              lVar5 = lVar5 + 0x18;
              pcVar4 = pcVar1;
            } while (lVar5 != 0x228);
            goto LAB_00112265;
          }
          pcVar4 = *(char **)((long)&categories[1].opt + lVar3);
          iVar2 = curl_strequal(pcVar4,category);
          lVar5 = lVar3 + 0x18;
        } while (iVar2 == 0);
        pcVar6 = (category_descriptors *)(lVar3 + 0x12bdd8);
      }
      else {
        pcVar6 = categories;
      }
      printf("%s: %s\n",pcVar4,pcVar6->desc);
      category_00 = pcVar6->category;
    }
    else {
      category_00 = 0xfffffffe;
    }
    print_category(category_00);
  }
LAB_00112265:
  free(category);
  return;
}

Assistant:

void tool_help(char *category)
{
  puts("Usage: curl [options...] <url>");
  /* If no category was provided */
  if(!category) {
    const char *category_note = "\nThis is not the full help, this "
      "menu is stripped into categories.\nUse \"--help category\" to get "
      "an overview of all categories.\nFor all options use the manual"
      " or \"--help all\".";
    print_category(CURLHELP_IMPORTANT);
    puts(category_note);
  }
  /* Lets print everything if "all" was provided */
  else if(curl_strequal(category, "all"))
    /* Print everything except hidden */
    print_category(~(CURLHELP_HIDDEN));
  /* Lets handle the string "category" differently to not print an errormsg */
  else if(curl_strequal(category, "category"))
    get_categories();
  /* Otherwise print category and handle the case if the cat was not found */
  else if(get_category_content(category)) {
    puts("Invalid category provided, here is a list of all categories:\n");
    get_categories();
  }
  free(category);
}